

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O1

void __thiscall
miniros::TransportPublisherLink::onRetryTimer
          (TransportPublisherLink *this,SteadyTimerEvent *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  int iVar7;
  string *psVar8;
  long lVar9;
  PollManagerPtr *pPVar10;
  ConnectionManagerPtr *pCVar11;
  socklen_t __len;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 *puVar12;
  sockaddr *__addr;
  _Any_data *p_Var13;
  element_type *this_02;
  _Any_data local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string topic;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  TransportPtr local_40;
  
  __len = (socklen_t)&local_a8;
  if ((this->dropping_ == false) && (this->needs_retry_ == true)) {
    topic._M_dataplus._M_p = (pointer)SteadyTime::now();
    bVar6 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator>
                      ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)&topic,
                       &this->next_retry_);
    if (bVar6) {
      DurationBase<miniros::WallDuration>::operator*
                ((DurationBase<miniros::WallDuration> *)&topic,2.0);
      local_a8._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      DurationBase<miniros::WallDuration>::fromSec
                ((DurationBase<miniros::WallDuration> *)&local_a8,20.0);
      bVar6 = DurationBase<miniros::WallDuration>::operator<
                        ((DurationBase<miniros::WallDuration> *)&local_a8,(WallDuration *)&topic);
      p_Var13 = (_Any_data *)&topic;
      if (bVar6) {
        p_Var13 = &local_a8;
      }
      (this->retry_period_).super_DurationBase<miniros::WallDuration> =
           *(DurationBase<miniros::WallDuration> *)&((string *)p_Var13)->_M_dataplus;
      this->needs_retry_ = false;
      this_01 = (this->super_PublisherLink).parent_.
                super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar7 = this_01->_M_use_count;
        do {
          if (iVar7 == 0) {
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar2 = this_01->_M_use_count;
          bVar6 = iVar7 == iVar2;
          if (bVar6) {
            this_01->_M_use_count = iVar7 + 1;
            iVar2 = iVar7;
          }
          iVar7 = iVar2;
          UNLOCK();
        } while (!bVar6);
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = this_01->_M_use_count == 0;
      }
      if (bVar6) {
        this_02 = (Subscription *)0x0;
      }
      else {
        this_02 = (this->super_PublisherLink).parent_.
                  super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      (*((((this->connection_).super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_Transport[9])();
      paVar1 = &topic.field_2;
      topic._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&topic,"TCPROS","");
      iVar7 = std::__cxx11::string::compare((char *)&topic);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)topic._M_dataplus._M_p != paVar1) {
        operator_delete(topic._M_dataplus._M_p,topic.field_2._M_allocated_capacity + 1);
      }
      if (iVar7 == 0) {
        if (this_02 == (Subscription *)0x0) {
          topic._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&topic,"unknown","");
        }
        else {
          psVar8 = Subscription::getName_abi_cxx11_(this_02);
          pcVar3 = (psVar8->_M_dataplus)._M_p;
          topic._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&topic,pcVar3,pcVar3 + psVar8->_M_string_length);
        }
        peVar4 = (this->connection_).
                 super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar5 = (peVar4->transport_).
                 super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar5 == (element_type *)0x0) {
          lVar9 = 0;
        }
        else {
          lVar9 = __dynamic_cast(peVar5,&Transport::typeinfo,&TransportTCP::typeinfo,0);
        }
        this_00 = (peVar4->transport_).
                  super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        __addr = (sockaddr *)(ulong)*(uint *)(lVar9 + 600);
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (onRetryTimer::loc.initialized_ == false) {
          local_a8._M_unused._M_object = &local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"miniros.transport_publisher_link","");
          console::initializeLogLocation(&onRetryTimer::loc,(string *)&local_a8,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_unused._0_8_ != &local_98) {
            operator_delete(local_a8._M_unused._M_object,(ulong)(local_98._M_allocated_capacity + 1)
                           );
          }
        }
        if (onRetryTimer::loc.level_ != Debug) {
          console::setLogLocationLevel(&onRetryTimer::loc,Debug);
          console::checkLogLocationEnabled(&onRetryTimer::loc);
        }
        puVar12 = (undefined8 *)(lVar9 + 0x238);
        if (onRetryTimer::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,onRetryTimer::loc.logger_,onRetryTimer::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                         ,0x110,
                         "void miniros::TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent &)"
                         ,"Retrying connection to [%s:%d] for topic [%s]",*puVar12,__addr,
                         topic._M_dataplus._M_p);
        }
        pPVar10 = PollManager::instance();
        local_a8._M_unused._M_object =
             (pPVar10->super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<miniros::TransportTCP,std::allocator<miniros::TransportTCP>,miniros::PollSet*>
                  (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(TransportTCP **)&transport,
                   (allocator<miniros::TransportTCP> *)&connection,(PollSet **)&local_a8);
        std::__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<miniros::TransportTCP,miniros::TransportTCP>
                  ((__shared_ptr<miniros::TransportTCP,(__gnu_cxx::_Lock_policy)2> *)&transport,
                   transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        iVar7 = TransportTCP::connect
                          (transport.
                           super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(int)puVar12,__addr,__len);
        if ((char)iVar7 == '\0') {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.initialized_ == false) {
            local_a8._M_unused._M_object = &local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"miniros.transport_publisher_link","");
            console::initializeLogLocation
                      (&onRetryTimer(miniros::SteadyTimerEvent_const&)::loc,(string *)&local_a8,
                       Debug);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_unused._0_8_ != &local_98) {
              operator_delete(local_a8._M_unused._M_object,
                              (ulong)(local_98._M_allocated_capacity + 1));
            }
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.level_ != Debug) {
            console::setLogLocationLevel(&onRetryTimer(miniros::SteadyTimerEvent_const&)::loc,Debug)
            ;
            console::checkLogLocationEnabled(&onRetryTimer(miniros::SteadyTimerEvent_const&)::loc);
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.logger_,
                           onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                           ,0x11e,
                           "void miniros::TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent &)"
                           ,"connect() failed when retrying connection to [%s:%d] for topic [%s]",
                           *puVar12,__addr,topic._M_dataplus._M_p);
          }
        }
        else {
          std::__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<miniros::Connection>>
                    ((__shared_ptr<miniros::Connection,(__gnu_cxx::_Lock_policy)2> *)&connection,
                     (allocator<miniros::Connection> *)&local_a8);
          local_40.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &(transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->super_Transport;
          local_40.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_98._M_allocated_capacity = 0;
          local_98._8_8_ = 0;
          local_a8._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_a8._8_8_ = 0;
          Connection::initialize
                    (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_40,false,(HeaderReceivedFunc *)&local_a8);
          if ((code *)local_98._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_98._M_allocated_capacity)(&local_a8,&local_a8,3);
          }
          if (local_40.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          bVar6 = initialize(this,&connection);
          if (bVar6) {
            pCVar11 = ConnectionManager::instance();
            ConnectionManager::addConnection
                      ((pCVar11->
                       super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,&connection);
          }
          if (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (connection.
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)topic._M_dataplus._M_p != &topic.field_2) {
          operator_delete(topic._M_dataplus._M_p,topic.field_2._M_allocated_capacity + 1);
        }
      }
      else if (this_02 != (Subscription *)0x0) {
        std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<miniros::PublisherLink,void>
                  ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&topic,
                   (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
                   &(this->super_PublisherLink).
                    super_enable_shared_from_this<miniros::PublisherLink>);
        Subscription::removePublisherLink(this_02,(PublisherLinkPtr *)&topic);
        if (topic._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)topic._M_string_length);
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
  }
  return;
}

Assistant:

void TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent&)
{
  if (dropping_)
  {
    return;
  }

  if (needs_retry_ && SteadyTime::now() > next_retry_)
  {
    retry_period_ = std::min<WallDuration>(retry_period_ * 2, WallDuration(20));
    needs_retry_ = false;
    SubscriptionPtr parent = parent_.lock();
    // TODO: support retry on more than just TCP
    // For now, since UDP does not have a heartbeat, we do not attempt to retry
    // UDP connections since an error there likely means some invalid operation has
    // happened.
    if (connection_->getTransport()->getType() == std::string("TCPROS"))
    {
      std::string topic = parent ? parent->getName() : "unknown";

      TransportTCPPtr old_transport = std::dynamic_pointer_cast<TransportTCP>(connection_->getTransport());
      MINIROS_ASSERT(old_transport);
      const std::string& host = old_transport->getConnectedHost();
      int port = old_transport->getConnectedPort();

      MINIROS_DEBUG("Retrying connection to [%s:%d] for topic [%s]", host.c_str(), port, topic.c_str());

      TransportTCPPtr transport(std::make_shared<TransportTCP>(&PollManager::instance()->getPollSet()));
      if (transport->connect(host, port))
      {
        ConnectionPtr connection(std::make_shared<Connection>());
        connection->initialize(transport, false, HeaderReceivedFunc());
        if (initialize(connection))
        {
          ConnectionManager::instance()->addConnection(connection);
        }
      }
      else
      {
        MINIROS_DEBUG("connect() failed when retrying connection to [%s:%d] for topic [%s]", host.c_str(), port, topic.c_str());
      }
    }
    else if (parent)
    {
      parent->removePublisherLink(shared_from_this());
    }
  }
}